

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O2

SatInfo miniscript::internal::operator|(SatInfo *a,SatInfo *b)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  SatInfo SVar6;
  
  if (a->valid == false) {
    uVar4._0_1_ = b->valid;
    uVar4._1_3_ = *(undefined3 *)&b->field_0x1;
    uVar4._4_4_ = b->netdiff;
    iVar1 = b->exec;
  }
  else {
    if (b->valid != false) {
      uVar2 = b->netdiff;
      if (b->netdiff < a->netdiff) {
        uVar2 = a->netdiff;
      }
      uVar3 = (ulong)uVar2;
      iVar1 = b->exec;
      if (b->exec < a->exec) {
        iVar1 = a->exec;
      }
      uVar4 = 0;
      uVar5 = 1;
      goto LAB_0032c760;
    }
    uVar4._0_1_ = a->valid;
    uVar4._1_3_ = *(undefined3 *)&a->field_0x1;
    uVar4._4_4_ = a->netdiff;
    iVar1 = a->exec;
  }
  uVar3 = uVar4 >> 0x20;
  uVar5 = uVar4;
LAB_0032c760:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    SVar6._0_8_ = uVar5 & 0xff | (ulong)((uint)uVar4 & 0xffffff00) | uVar3 << 0x20;
    SVar6.exec = iVar1;
    return SVar6;
  }
  __stack_chk_fail();
}

Assistant:

SatInfo operator|(const SatInfo& a, const SatInfo& b) noexcept
    {
        // Union with an empty set is itself.
        if (!a.valid) return b;
        if (!b.valid) return a;
        // Otherwise the netdiff and exec of the union is the maximum of the individual values.
        return {std::max(a.netdiff, b.netdiff), std::max(a.exec, b.exec)};
    }